

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

CppType __thiscall google::protobuf::MapKey::type(MapKey *this)

{
  LogMessage *this_00;
  LogMessage *other;
  long in_RDI;
  char *in_stack_ffffffffffffff88;
  LogMessage *in_stack_ffffffffffffff90;
  LogMessage *in_stack_ffffffffffffffa0;
  undefined1 local_40 [64];
  
  if (*(int *)(in_RDI + 8) == 0) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffffa0,(LogLevel_conflict)((ulong)local_40 >> 0x20),
               (char *)in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    internal::LogMessage::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    this_00 = internal::LogMessage::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    other = internal::LogMessage::operator<<(this_00,in_stack_ffffffffffffff88);
    internal::LogFinisher::operator=((LogFinisher *)this_00,other);
    internal::LogMessage::~LogMessage((LogMessage *)0x43f4be);
  }
  return *(CppType *)(in_RDI + 8);
}

Assistant:

FieldDescriptor::CppType type() const {
    if (type_ == 0) {
      GOOGLE_LOG(FATAL) << "Protocol Buffer map usage error:\n"
                 << "MapKey::type MapKey is not initialized. "
                 << "Call set methods to initialize MapKey.";
    }
    return (FieldDescriptor::CppType)type_;
  }